

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

size_t __thiscall
CVmObjStrComp::match_chars(CVmObjStrComp *this,wchar_t *valstr,size_t vallen,wchar_t refch)

{
  wchar_t wVar1;
  vmobj_strcmp_equiv *pvVar2;
  int iVar3;
  vmobj_strcmp_ext *blen;
  wchar_t **a;
  size_t *alen;
  wchar_t in_ECX;
  size_t *in_RDX;
  wchar_t **in_RSI;
  CVmObjStrComp *in_RDI;
  bool bVar4;
  size_t vlen;
  wchar_t *vp;
  wchar_t *refstr;
  size_t reflen;
  size_t ovallen;
  wchar_t *start;
  wchar_t valch;
  vmobj_strcmp_equiv *eq;
  vmobj_strcmp_equiv **t1;
  int fold_case;
  vmobj_strcmp_ext *ext;
  size_t local_80;
  wchar_t *local_78;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  blen = get_ext(in_RDI);
  bVar4 = blen->case_sensitive != 0;
  wVar1 = *(wchar_t *)in_RSI;
  if (in_ECX == wVar1) {
    local_8 = 1;
  }
  else {
    alen = in_RDX;
    a = in_RSI;
    if ((bVar4) ||
       (iVar3 = t3_compare_case_fold_min
                          (in_RSI,in_RDX,(wchar_t **)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           &blen->trunc_len), iVar3 != 0)) {
      if ((blen->equiv[in_ECX >> 8 & 0xff] == (vmobj_strcmp_equiv **)0x0) ||
         (pvVar2 = blen->equiv[in_ECX >> 8 & 0xff][in_ECX & 0xff],
         pvVar2 == (vmobj_strcmp_equiv *)0x0)) {
        local_8 = 0;
      }
      else {
        local_78 = pvVar2->val_ch;
        local_80 = pvVar2->val_ch_cnt;
        do {
          while( true ) {
            if (alen == (size_t *)0x0 || local_80 == 0) {
              return (long)a - (long)in_RSI >> 2;
            }
            if (*local_78 != wVar1) break;
            a = (wchar_t **)((long)a + 4);
            alen = (size_t *)((long)alen + -1);
            local_78 = local_78 + 1;
            local_80 = local_80 - 1;
          }
        } while ((!bVar4) &&
                (iVar3 = t3_compare_case_fold_min
                                   (a,alen,(wchar_t **)CONCAT44(*local_78,in_stack_ffffffffffffffd8)
                                    ,&blen->trunc_len), iVar3 == 0));
        local_8 = 0;
      }
    }
    else {
      local_8 = (long)in_RDX - (long)alen;
    }
  }
  return local_8;
}

Assistant:

size_t CVmObjStrComp::match_chars(const wchar_t *valstr, size_t vallen,
                                  wchar_t refch)
{
    vmobj_strcmp_ext *ext = get_ext();
    int fold_case = !(ext->case_sensitive);
    vmobj_strcmp_equiv **t1;
    vmobj_strcmp_equiv *eq;
    wchar_t valch = *valstr;
    const wchar_t *start = valstr;

    /* check for an exact match first */
    if (refch == valch)
        return 1;
            
    /* check for a case-folded match if we're insensitive to case */
    if (fold_case)
    {
        /* try a minimum case-folded match to the one-character ref string */
        size_t ovallen = vallen, reflen = 1;
        const wchar_t *refstr = &refch;
        if (t3_compare_case_fold_min(valstr, vallen, refstr, reflen) == 0)
        {
            /* got it - return the length we consumed from the value string */
            return ovallen - vallen;
        }
    }

    /* check for a reference equivalence mapping */
    if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
        && (eq = t1[refch & 0xFF]) != 0)
    {
        /* match each character from the mapping string */
        const wchar_t *vp;
        size_t vlen;
        for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
             vallen != 0 && vlen != 0 ; )
        {
            /* get this mapping character */
            refch = *vp;

            /* if we have an exact match, keep going */
            if (refch == valch)
            {
                /* matched exactly - skip this character and keep going */
                ++valstr, --vallen;
                ++vp, --vlen;
                continue;
            }

            /* check for a case-folded match if appropriate */
            if (fold_case
                && t3_compare_case_fold_min(valstr, vallen, vp, vlen) == 0)
            {
                /* matched - keep going */
                continue;
            }

            /* no match */
            return 0;
        }

        /* we've matched the mapping - return the match length */
        return valstr - start;
    }

    /* it doesn't match any of the possibilities */
    return 0;
}